

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

string * __thiscall
fmt::v8::vformat_abi_cxx11_
          (string *__return_storage_ptr__,v8 *this,string_view fmt,format_args args)

{
  basic_string_view<char> fmt_00;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_00;
  buffer<char> local_248;
  char local_228 [536];
  
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
        )args.desc_;
  args_00.desc_ = fmt.size_;
  fmt_00.size_ = fmt.data_;
  local_248.size_ = 0;
  local_248._vptr_buffer = (_func_int **)&PTR_grow_0023a868;
  local_248.capacity_ = 500;
  fmt_00.data_ = (char *)this;
  local_248.ptr_ = local_228;
  detail::vformat_to<char>(&local_248,fmt_00,args_00,(locale_ref)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_248.ptr_,local_248.ptr_ + local_248.size_);
  if (local_248.ptr_ != local_228) {
    operator_delete(local_248.ptr_,local_248.capacity_);
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC std::string vformat(string_view fmt, format_args args) {
  // Don't optimize the "{}" case to keep the binary size small and because it
  // can be better optimized in fmt::format anyway.
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  return to_string(buffer);
}